

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

arith_uint256 *
CalculateClaimedHeadersWork
          (arith_uint256 *__return_storage_ptr__,
          span<const_CBlockHeader,_18446744073709551615UL> headers)

{
  int i;
  long lVar1;
  ulong uVar2;
  pointer pCVar3;
  pointer pCVar4;
  CBlockHeader *header;
  long in_FS_OFFSET;
  arith_uint256 local_f8;
  CBlockIndex local_d8;
  long local_38;
  
  pCVar3 = headers._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_base_uint<256U>).pn[4] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[5] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[6] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[7] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[0] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[1] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[2] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[3] = 0;
  if (headers._M_extent._M_extent_value._M_extent_value != 0) {
    pCVar4 = pCVar3 + headers._M_extent._M_extent_value._M_extent_value;
    do {
      local_d8.m_chain_tx_count = 0;
      local_d8.nStatus = 0;
      local_d8.phashBlock = (uint256 *)0x0;
      local_d8.pprev = (CBlockIndex *)0x0;
      local_d8.pskip = (CBlockIndex *)0x0;
      local_d8.nHeight = 0;
      local_d8.nFile = 0;
      local_d8.nDataPos = 0;
      local_d8.nUndoPos = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[0] = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[1] = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[2] = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[3] = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[4] = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[5] = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[6] = 0;
      local_d8.nChainWork.super_base_uint<256U>.pn[7] = 0;
      local_d8.nTx = 0;
      local_d8.nVersion = pCVar3->nVersion;
      local_d8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems;
      local_d8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8);
      local_d8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_d8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_d8.nTime = pCVar3->nTime;
      local_d8.nBits = pCVar3->nBits;
      local_d8.nNonce = pCVar3->nNonce;
      local_d8.nSequenceId = 0;
      local_d8.nTimeMax = 0;
      GetBlockProof(&local_f8,&local_d8);
      lVar1 = 0;
      uVar2 = 0;
      do {
        uVar2 = (ulong)local_f8.super_base_uint<256U>.pn[lVar1] +
                (__return_storage_ptr__->super_base_uint<256U>).pn[lVar1] + uVar2;
        (__return_storage_ptr__->super_base_uint<256U>).pn[lVar1] = (uint32_t)uVar2;
        uVar2 = uVar2 >> 0x20;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 CalculateClaimedHeadersWork(std::span<const CBlockHeader> headers)
{
    arith_uint256 total_work{0};
    for (const CBlockHeader& header : headers) {
        CBlockIndex dummy(header);
        total_work += GetBlockProof(dummy);
    }
    return total_work;
}